

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScript.c
# Opt level: O0

void Gia_ManPerformFlow3(int nLutSize,int nCutNum,int fBalance,int fMinAve,int fUseMfs,
                        int fUseLutLib,int fVerbose)

{
  int iVar1;
  Abc_Frame_t *pAVar2;
  Gia_Man_t *pGVar3;
  char *pcVar4;
  char *pcVar5;
  char local_288 [8];
  char Comm3 [200];
  char local_1b8 [8];
  char Comm2 [200];
  char local_e8 [8];
  char Comm1 [200];
  int fUseLutLib_local;
  int fUseMfs_local;
  int fMinAve_local;
  int fBalance_local;
  int nCutNum_local;
  int nLutSize_local;
  
  Comm1._192_4_ = fUseLutLib;
  Comm1._196_4_ = fUseMfs;
  if (fUseLutLib == 0) {
    sprintf(local_e8,"&st; &if -C %d -K %d; &save; &st; &syn2; &if -C %d -K %d; &save; &load",
            (ulong)(uint)nCutNum,(ulong)(uint)nLutSize,(ulong)(uint)nCutNum,(ulong)(uint)nLutSize);
  }
  else {
    sprintf(local_e8,"&st; &if -C %d;       &save; &st; &syn2; &if -C %d;       &save; &load",
            (ulong)(uint)nCutNum,(ulong)(uint)nCutNum);
  }
  if (Comm1._192_4_ == 0) {
    iVar1 = Abc_NtkRecIsRunning3();
    pcVar4 = "Wd#GL. G8Wd&L WdG#HL. G8Wg&L dM#GQ dM&GQ ZGdM# Z&GgM GQMdj# GQ8dM& dMjZG# g";
    if (iVar1 != 0) {
      pcVar4 = "I4 4+vI Jv4 g4Jv 4Iv5 v4>I v4J5 v>J4 4QvI vI4+Q Z4Jv ZJg4 p4vI pvI>4 pvJ4 y";
    }
    pcVar5 = "";
    if (Comm1._196_4_ != 0) {
      pcVar5 = "&mfs; ";
    }
    sprintf(local_1b8,"&st; &if -%s -K 6; &dch -f; &if -C %d -K %d; %s&save; &load",pcVar4 + 0x4a,
            (ulong)(uint)nCutNum,(ulong)(uint)nLutSize,pcVar5);
  }
  else {
    iVar1 = Abc_NtkRecIsRunning3();
    pcVar4 = "Wd#GL. G8Wd&L WdG#HL. G8Wg&L dM#GQ dM&GQ ZGdM# Z&GgM GQMdj# GQ8dM& dMjZG# g";
    if (iVar1 != 0) {
      pcVar4 = "I4 4+vI Jv4 g4Jv 4Iv5 v4>I v4J5 v>J4 4QvI vI4+Q Z4Jv ZJg4 p4vI pvI>4 pvJ4 y";
    }
    pcVar5 = "";
    if (Comm1._196_4_ != 0) {
      pcVar5 = "&mfs; ";
    }
    sprintf(local_1b8,"&st; &if -%s -K 6; &dch -f; &if -C %d;       %s&save; &load",pcVar4 + 0x4a,
            (ulong)(uint)nCutNum,pcVar5);
  }
  if (Comm1._192_4_ == 0) {
    iVar1 = Abc_NtkRecIsRunning3();
    pcVar4 = "Wd#GL. G8Wd&L WdG#HL. G8Wg&L dM#GQ dM&GQ ZGdM# Z&GgM GQMdj# GQ8dM& dMjZG# g";
    if (iVar1 != 0) {
      pcVar4 = "I4 4+vI Jv4 g4Jv 4Iv5 v4>I v4J5 v>J4 4QvI vI4+Q Z4Jv ZJg4 p4vI pvI>4 pvJ4 y";
    }
    pcVar5 = "";
    if (Comm1._196_4_ != 0) {
      pcVar5 = "&mfs; ";
    }
    sprintf(local_288,"&st; &if -%s -K 6; &synch2; &if -C %d -K %d; %s&save; &load",pcVar4 + 0x4a,
            (ulong)(uint)nCutNum,(ulong)(uint)nLutSize,pcVar5);
  }
  else {
    iVar1 = Abc_NtkRecIsRunning3();
    pcVar4 = "Wd#GL. G8Wd&L WdG#HL. G8Wg&L dM#GQ dM&GQ ZGdM# Z&GgM GQMdj# GQ8dM& dMjZG# g";
    if (iVar1 != 0) {
      pcVar4 = "I4 4+vI Jv4 g4Jv 4Iv5 v4>I v4J5 v>J4 4QvI vI4+Q Z4Jv ZJg4 p4vI pvI>4 pvJ4 y";
    }
    pcVar5 = "";
    if (Comm1._196_4_ != 0) {
      pcVar5 = "&mfs; ";
    }
    sprintf(local_288,"&st; &if -%s -K 6; &synch2; &if -C %d;       %s&save; &load",pcVar4 + 0x4a,
            (ulong)(uint)nCutNum,pcVar5);
  }
  if (fVerbose != 0) {
    iVar1 = Abc_NtkRecIsRunning3();
    pcVar4 = "SOP balancing";
    if (iVar1 != 0) {
      pcVar4 = "LMS";
    }
    printf("Trying simple synthesis with %s...\n",pcVar4);
  }
  pAVar2 = Abc_FrameGetGlobalFrame();
  Cmd_CommandExecute(pAVar2,local_e8);
  if (fVerbose != 0) {
    pAVar2 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar2,"&ps");
  }
  pAVar2 = Abc_FrameGetGlobalFrame();
  pGVar3 = Abc_FrameReadGia(pAVar2);
  iVar1 = Gia_ManAndNum(pGVar3);
  if (iVar1 < 200000) {
    if (fVerbose != 0) {
      printf("Trying medium synthesis...\n");
    }
    pAVar2 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar2,local_1b8);
    if (fVerbose != 0) {
      pAVar2 = Abc_FrameGetGlobalFrame();
      Cmd_CommandExecute(pAVar2,"&ps");
    }
  }
  pAVar2 = Abc_FrameGetGlobalFrame();
  pGVar3 = Abc_FrameReadGia(pAVar2);
  iVar1 = Gia_ManAndNum(pGVar3);
  if (iVar1 < 10000) {
    if (fVerbose != 0) {
      printf("Trying harder synthesis...\n");
    }
    pAVar2 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar2,local_288);
    if (fVerbose != 0) {
      pAVar2 = Abc_FrameGetGlobalFrame();
      Cmd_CommandExecute(pAVar2,"&ps");
    }
  }
  if (fVerbose != 0) {
    printf("Final result...\n");
    pAVar2 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar2,"&ps");
  }
  return;
}

Assistant:

void Gia_ManPerformFlow3( int nLutSize, int nCutNum, int fBalance, int fMinAve, int fUseMfs, int fUseLutLib, int fVerbose )
{
    char Comm1[200], Comm2[200], Comm3[200];
    if ( fUseLutLib )
        sprintf( Comm1, "&st; &if -C %d;       &save; &st; &syn2; &if -C %d;       &save; &load", nCutNum, nCutNum );
    else
        sprintf( Comm1, "&st; &if -C %d -K %d; &save; &st; &syn2; &if -C %d -K %d; &save; &load", nCutNum, nLutSize, nCutNum, nLutSize );
    if ( fUseLutLib )
        sprintf( Comm2, "&st; &if -%s -K 6; &dch -f; &if -C %d;       %s&save; &load", Abc_NtkRecIsRunning3() ? "y" : "g", nCutNum,           fUseMfs ? "&mfs; ":"" );
    else
        sprintf( Comm2, "&st; &if -%s -K 6; &dch -f; &if -C %d -K %d; %s&save; &load", Abc_NtkRecIsRunning3() ? "y" : "g", nCutNum, nLutSize, fUseMfs ? "&mfs; ":"" );
    if ( fUseLutLib )
        sprintf( Comm3, "&st; &if -%s -K 6; &synch2; &if -C %d;       %s&save; &load", Abc_NtkRecIsRunning3() ? "y" : "g", nCutNum,           fUseMfs ? "&mfs; ":"" );
    else
        sprintf( Comm3, "&st; &if -%s -K 6; &synch2; &if -C %d -K %d; %s&save; &load", Abc_NtkRecIsRunning3() ? "y" : "g", nCutNum, nLutSize, fUseMfs ? "&mfs; ":"" );

    if ( fVerbose ) printf( "Trying simple synthesis with %s...\n", Abc_NtkRecIsRunning3() ? "LMS" : "SOP balancing" );
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Comm1 );
    if ( fVerbose )
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&ps" );

    if ( Gia_ManAndNum( Abc_FrameReadGia(Abc_FrameGetGlobalFrame()) ) < 200000 )
    {
        if ( fVerbose ) printf( "Trying medium synthesis...\n" );
        Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Comm2 );
        if ( fVerbose )
        Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&ps" );
    }

    if ( Gia_ManAndNum( Abc_FrameReadGia(Abc_FrameGetGlobalFrame()) ) < 10000 )
    {
        if ( fVerbose ) printf( "Trying harder synthesis...\n" );
        Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Comm3 );
        if ( fVerbose )
        Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&ps" );
    }

    if ( fVerbose ) printf( "Final result...\n" );
    if ( fVerbose )
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&ps" );
}